

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::detail::
eval_function<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
          (detail *this,Dispatch_Engine *t_ss,
          AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *t_node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *t_param_names,Function_Params *t_vals,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          *t_locals,bool has_this_capture)

{
  pointer pQVar1;
  pointer ppVar2;
  int iVar3;
  _Base_ptr p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Type_Conversions *this_00;
  long lVar5;
  ulong uVar6;
  pointer pbVar7;
  vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>
  *this_01;
  _Rb_tree_header *p_Var8;
  Boxed_Value *pBVar9;
  long lVar10;
  Boxed_Value BVar11;
  Dispatch_State state;
  Dispatch_State local_a8;
  Boxed_Value local_88;
  Boxed_Value local_78;
  Boxed_Value local_68;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *local_58;
  string local_50;
  
  local_a8.m_engine._M_data = t_ss;
  local_58 = t_node;
  local_a8.m_stack_holder._M_data = chaiscript::detail::Dispatch_Engine::get_stack_holder(t_ss);
  this_00 = &t_ss->m_conversions;
  local_a8.m_conversions.m_saves._M_data = Type_Conversions::conversion_saves(this_00);
  pQVar1 = ((local_a8.m_stack_holder._M_data)->stacks).
           super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = pQVar1[-1].data.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a8.m_conversions.m_conversions._M_data = this_00;
  if ((pQVar1[-1].data.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       ._M_impl.super__Vector_impl_data._M_start == ppVar2) ||
     (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&ppVar2[-1].first,"__this"), iVar3 != 0)) {
    pBVar9 = (Boxed_Value *)0x0;
    if (t_vals->m_begin != t_vals->m_end) {
      pBVar9 = t_vals->m_begin;
    }
  }
  else {
    pBVar9 = &pQVar1[-1].data.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].second;
  }
  local_50._M_dataplus._M_p._0_4_ = 1;
  std::
  vector<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
  ::emplace_back<int>(&(local_a8.m_stack_holder._M_data)->stacks,(int *)&local_50);
  if (pBVar9 != (Boxed_Value *)0x0 && !has_this_capture) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"this","");
    local_68.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (pBVar9->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (pBVar9->m_data).
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_68.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_68.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_68.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_68.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_68.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    chaiscript::detail::Dispatch_State::add_object(&local_a8,&local_50,&local_68);
    if (local_68.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (t_locals !=
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       *)0x0) {
    p_Var4 = (t_locals->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(t_locals->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var8) {
      do {
        local_78.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(p_Var4 + 2);
        local_78.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[2]._M_parent;
        if ((_Base_ptr)
            local_78.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((_Base_ptr)
                     local_78.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_parent =
                 *(int *)&((_Base_ptr)
                          local_78.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&((_Base_ptr)
                     local_78.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_parent =
                 *(int *)&((_Base_ptr)
                          local_78.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_parent + 1;
          }
        }
        chaiscript::detail::Dispatch_State::add_object(&local_a8,(string *)(p_Var4 + 1),&local_78);
        if ((_Base_ptr)
            local_78.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var8);
    }
  }
  pbVar7 = (t_param_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((t_param_names->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
    lVar5 = 4;
    lVar10 = 0;
    uVar6 = 0;
    do {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&(pbVar7->_M_dataplus)._M_p + lVar10),"this");
      if (iVar3 != 0) {
        pbVar7 = (t_param_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_88.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)((long)t_vals->m_begin + lVar5 * 2 + -8);
        local_88.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(t_vals->m_begin->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar5 * 2);
        if (local_88.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_88.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_88.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_88.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_88.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        chaiscript::detail::Dispatch_State::add_object
                  (&local_a8,(string *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10),&local_88);
        if (local_88.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      uVar6 = uVar6 + 1;
      pbVar7 = (t_param_names->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x20;
      lVar5 = lVar5 + 8;
    } while (uVar6 < (ulong)((long)(t_param_names->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5))
    ;
  }
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)this,
             (Dispatch_State *)local_58);
  this_01 = ((local_a8.m_stack_holder._M_data)->stacks).
            super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  ((local_a8.m_stack_holder._M_data)->stacks).
  super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = this_01;
  std::
  vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>
  ::~vector(this_01);
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Boxed_Value eval_function(chaiscript::detail::Dispatch_Engine &t_ss,
                                const AST_Node_Impl<T> &t_node,
                                const std::vector<std::string> &t_param_names,
                                const Function_Params &t_vals,
                                const std::map<std::string, Boxed_Value> *t_locals = nullptr,
                                bool has_this_capture = false) {
        chaiscript::detail::Dispatch_State state(t_ss);

        const Boxed_Value *thisobj = [&]() -> const Boxed_Value * {
          if (auto &stack = t_ss.get_stack_data(state.stack_holder()).back(); !stack.empty() && stack.back().first == "__this") {
            return &stack.back().second;
          } else if (!t_vals.empty()) {
            return &t_vals[0];
          } else {
            return nullptr;
          }
        }();

        chaiscript::eval::detail::Stack_Push_Pop tpp(state);
        if (thisobj && !has_this_capture) {
          state.add_object("this", *thisobj);
        }

        if (t_locals) {
          for (const auto &[name, value] : *t_locals) {
            state.add_object(name, value);
          }
        }

        for (size_t i = 0; i < t_param_names.size(); ++i) {
          if (t_param_names[i] != "this") {
            state.add_object(t_param_names[i], t_vals[i]);
          }
        }

        try {
          return t_node.eval(state);
        } catch (detail::Return_Value &rv) {
          return std::move(rv.retval);
        }
      }